

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O3

bool __thiscall
cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator!=(iterator *this,iterator other)

{
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *pcVar1;
  bool bVar2;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLinkedTree.h"
                  ,0x6e,
                  "bool cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator!=(iterator) const [T = cmStateDetail::PolicyStackEntry]"
                 );
  }
  if ((long)(pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 ==
      ((long)(pcVar1->Data).
             super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(pcVar1->Data).
             super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7) {
    bVar2 = operator==(this,other);
    return !bVar2;
  }
  __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLinkedTree.h"
                ,0x6f,
                "bool cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator!=(iterator) const [T = cmStateDetail::PolicyStackEntry]"
               );
}

Assistant:

bool operator!=(iterator other) const
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      return !(*this == other);
    }